

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtp-rb.c
# Opt level: O3

void rtp_rb_clear(void)

{
  uchar *puVar1;
  long lVar2;
  rtp_pkt_t *prVar3;
  ulong uVar4;
  
  rtp_rb_start = 0;
  rtp_rb_end = 0;
  rtp_rb_cnt = 0;
  if (rtp_rb_size != 0) {
    lVar2 = 0;
    uVar4 = 0;
    prVar3 = rtp_rb;
    do {
      rtp_pkt_init((rtp_pkt_t *)(prVar3->data + lVar2 + -0x28));
      prVar3 = rtp_rb;
      puVar1 = rtp_rb->data + lVar2 + -8;
      puVar1[0] = '\0';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      puVar1[4] = '\0';
      puVar1[5] = '\0';
      puVar1[6] = '\0';
      puVar1[7] = '\0';
      uVar4 = uVar4 + 1;
      lVar2 = lVar2 + 0x628;
    } while (uVar4 < rtp_rb_size);
  }
  return;
}

Assistant:

void rtp_rb_clear(void) {
  rtp_rb_start = 0;
  rtp_rb_end   = 0;
  rtp_rb_cnt   = 0;

  int i;
  for (i = 0; i < rtp_rb_size; i++) {
    rtp_pkt_init(rtp_rb + i);
    rtp_rb[i].length = 0;
  }
}